

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O0

DWORD SleepEx(DWORD dwMilliseconds,BOOL bAlertable)

{
  PAL_ERROR PVar1;
  CPalThread *pThread_00;
  CPalThread *pThread;
  DWORD dwRet;
  BOOL bAlertable_local;
  DWORD dwMilliseconds_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  PVar1 = CorUnix::InternalSleepEx(pThread_00,dwMilliseconds,bAlertable);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return PVar1;
}

Assistant:

DWORD
PALAPI
SleepEx(IN DWORD dwMilliseconds,
        IN BOOL bAlertable)
{
    DWORD dwRet;

    PERF_ENTRY(SleepEx);
    ENTRY("SleepEx(dwMilliseconds=%u, bAlertable=%d)\n", dwMilliseconds, bAlertable);

    CPalThread * pThread = InternalGetCurrentThread();

    dwRet = InternalSleepEx(pThread, dwMilliseconds, bAlertable);

    LOGEXIT("SleepEx returns DWORD %u\n", dwRet);
    PERF_EXIT(SleepEx);

    return dwRet;
}